

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O2

void mzd_addmul_v_s128_30_256(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  mzd_addmul_v_s128_30_256_idx(c,A,v->w64[3] >> 0x22);
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_30_256(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  mzd_addmul_v_s128_30_256_idx(c, A, CONST_BLOCK(v, 0)->w64[3] >> 34);
}